

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall
discordpp::Application::Application
          (Application *this,field<discordpp::Snowflake> *id,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *icon,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,
          omittable_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *rpc_origins,field<bool> *bot_public,field<bool> *bot_require_code_grant,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *terms_of_service_url,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *privacy_policy_url,omittable_field<discordpp::User> *owner,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *summary,field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *verify_key,nullable_field<discordpp::Team> *team,
          omittable_field<discordpp::Snowflake> *guild_id,
          omittable_field<discordpp::Snowflake> *primary_sku_id,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *slug,omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *cover_image,omittable_field<int> *flags,
          omittable_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tags,omittable_field<discordpp::InstallParams> *install_params,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *custom_install_url,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *role_connections_verification_url)

{
  omittable_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *rpc_origins_local;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *description_local;
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *icon_local;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *name_local;
  field<discordpp::Snowflake> *id_local;
  Application *this_local;
  
  field<discordpp::Snowflake>::field(&this->id,id);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,name);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  nullable_field(&this->icon,icon);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->description,description);
  omittable_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::omittable_field(&this->rpc_origins,rpc_origins);
  field<bool>::field(&this->bot_public,bot_public);
  field<bool>::field(&this->bot_require_code_grant,bot_require_code_grant);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->terms_of_service_url,terms_of_service_url);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->privacy_policy_url,privacy_policy_url);
  omittable_field<discordpp::User>::omittable_field(&this->owner,owner);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->summary,summary);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->verify_key,verify_key);
  nullable_field<discordpp::Team>::nullable_field(&this->team,team);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->guild_id,guild_id);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->primary_sku_id,primary_sku_id);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->slug,slug);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->cover_image,cover_image);
  omittable_field<int>::omittable_field(&this->flags,flags);
  omittable_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::omittable_field(&this->tags,tags);
  omittable_field<discordpp::InstallParams>::omittable_field(&this->install_params,install_params);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->custom_install_url,custom_install_url);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->role_connections_verification_url,role_connections_verification_url);
  return;
}

Assistant:

Application(
        field<Snowflake> id = uninitialized,
        field<std::string> name = uninitialized,
        nullable_field<std::string> icon = uninitialized,
        field<std::string> description = uninitialized,
        omittable_field<std::vector<std::string> > rpc_origins = omitted,
        field<bool> bot_public = uninitialized,
        field<bool> bot_require_code_grant = uninitialized,
        omittable_field<std::string> terms_of_service_url = omitted,
        omittable_field<std::string> privacy_policy_url = omitted,
        omittable_field<User> owner = omitted,
        field<std::string> summary = uninitialized,
        field<std::string> verify_key = uninitialized,
        nullable_field<Team> team = uninitialized,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<Snowflake> primary_sku_id = omitted,
        omittable_field<std::string> slug = omitted,
        omittable_field<std::string> cover_image = omitted,
        omittable_field<int> flags = omitted,
        omittable_field<std::vector<std::string> > tags = omitted,
        omittable_field<InstallParams> install_params = omitted,
        omittable_field<std::string> custom_install_url = omitted,
        omittable_field<std::string> role_connections_verification_url = omitted
    ):
        id(id),
        name(name),
        icon(icon),
        description(description),
        rpc_origins(rpc_origins),
        bot_public(bot_public),
        bot_require_code_grant(bot_require_code_grant),
        terms_of_service_url(terms_of_service_url),
        privacy_policy_url(privacy_policy_url),
        owner(owner),
        summary(summary),
        verify_key(verify_key),
        team(team),
        guild_id(guild_id),
        primary_sku_id(primary_sku_id),
        slug(slug),
        cover_image(cover_image),
        flags(flags),
        tags(tags),
        install_params(install_params),
        custom_install_url(custom_install_url),
        role_connections_verification_url(role_connections_verification_url)
    {}